

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkSupport(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar3;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,local_24);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    Abc_NtkNodeSupport_rec(pAVar3,vNodes_00);
  }
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_24);
    iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
    if (iVar1 == 0) {
      Vec_PtrPush(vNodes_00,pAVar3);
    }
  }
  iVar1 = Vec_PtrSize(vNodes_00);
  iVar2 = Abc_NtkCiNum(pNtk);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x36b,"Vec_Ptr_t *Abc_NtkSupport(Abc_Ntk_t *)");
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkSupport( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkNodeSupport_rec( Abc_ObjFanin0(pNode), vNodes );
    // add unused CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        if ( !Abc_NodeIsTravIdCurrent( pNode ) )
            Vec_PtrPush( vNodes, pNode );
    assert( Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk) );
    return vNodes;
}